

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

bool bssl::tls13_export_keying_material
               (SSL *ssl,Span<unsigned_char> out,Span<const_unsigned_char> secret,string_view label,
               Span<const_unsigned_char> context)

{
  string_view label_00;
  string_view label_01;
  Span<const_unsigned_char> hash_00;
  Span<const_unsigned_char> hash_01;
  Span<unsigned_char> out_00;
  Span<const_unsigned_char> secret_00;
  Span<unsigned_char> out_01;
  bool bVar1;
  int iVar2;
  SSL_SESSION *session;
  EVP_MD *type;
  uchar *data;
  size_t count;
  undefined4 extraout_var;
  bool local_1e1;
  uchar *local_1c8;
  size_t sStack_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  Span<const_unsigned_char> local_1a8;
  uchar *local_198;
  size_t local_190;
  uchar *local_188;
  size_t sStack_180;
  size_t local_178;
  char *pcStack_170;
  SSL *local_168;
  uchar *local_160;
  uchar *local_158;
  uchar *local_150;
  undefined1 local_148 [8];
  Span<unsigned_char> derived_secret;
  uint8_t derived_secret_buf [64];
  undefined1 local_f0 [8];
  Span<unsigned_char> export_context;
  Span<unsigned_char> hash;
  uint export_context_len;
  uint hash_len;
  uint8_t export_context_buf [64];
  uint8_t hash_buf [64];
  EVP_MD *digest;
  SSL *ssl_local;
  Span<const_unsigned_char> secret_local;
  Span<unsigned_char> out_local;
  
  secret_local.size_ = (size_t)out.data_;
  secret_local.data_ = (uchar *)secret.size_;
  ssl_local = (SSL *)secret.data_;
  bVar1 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&ssl_local);
  if (!bVar1) {
    session = SSL_get_session((SSL *)ssl);
    type = (EVP_MD *)ssl_session_get_digest((SSL_SESSION *)session);
    data = Span<const_unsigned_char>::data(&context);
    count = Span<const_unsigned_char>::size(&context);
    iVar2 = EVP_Digest(data,count,export_context_buf + 0x38,(uint *)((long)&hash.size_ + 4),type,
                       (ENGINE *)0x0);
    if ((iVar2 == 0) ||
       (iVar2 = EVP_Digest((void *)0x0,0,(uchar *)&export_context_len,(uint *)&hash.size_,type,
                           (ENGINE *)0x0), iVar2 == 0)) {
      out_local.size_._7_1_ = false;
    }
    else {
      Span<unsigned_char>::Span
                ((Span<unsigned_char> *)&export_context.size_,export_context_buf + 0x38,
                 (ulong)hash.size_._4_4_);
      Span<unsigned_char>::Span
                ((Span<unsigned_char> *)local_f0,(uchar *)&export_context_len,
                 (ulong)(uint)hash.size_);
      iVar2 = EVP_MD_size(type);
      Span<unsigned_char>::Span
                ((Span<unsigned_char> *)local_148,(uchar *)&derived_secret.size_,
                 CONCAT44(extraout_var,iVar2));
      local_158 = (uchar *)local_148;
      local_150 = derived_secret.data_;
      local_168 = ssl_local;
      local_160 = secret_local.data_;
      local_178 = label._M_len;
      pcStack_170 = label._M_str;
      Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                ((Span<unsigned_char_const> *)&local_188,(Span<unsigned_char> *)local_f0);
      iVar2 = SSL_is_dtls(ssl);
      out_01.size_ = (size_t)local_150;
      out_01.data_ = local_158;
      secret_00.size_ = (size_t)local_160;
      secret_00.data_ = (uchar *)local_168;
      label_00._M_str = pcStack_170;
      label_00._M_len = local_178;
      hash_00.size_ = sStack_180;
      hash_00.data_ = local_188;
      bVar1 = hkdf_expand_label(out_01,(EVP_MD *)type,secret_00,label_00,hash_00,iVar2 != 0);
      local_1e1 = false;
      if (bVar1) {
        local_198 = (uchar *)secret_local.size_;
        local_190 = out.size_;
        Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                  ((Span<unsigned_char_const> *)&local_1a8,(Span<unsigned_char> *)local_148);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1b8,"exporter");
        Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                  ((Span<unsigned_char_const> *)&local_1c8,
                   (Span<unsigned_char> *)&export_context.size_);
        iVar2 = SSL_is_dtls(ssl);
        out_00.size_ = local_190;
        out_00.data_ = local_198;
        label_01._M_str = local_1b8._M_str;
        label_01._M_len = local_1b8._M_len;
        hash_01.size_ = sStack_1c0;
        hash_01.data_ = local_1c8;
        local_1e1 = hkdf_expand_label(out_00,(EVP_MD *)type,local_1a8,label_01,hash_01,iVar2 != 0);
      }
      out_local.size_._7_1_ = local_1e1;
    }
    return out_local.size_._7_1_;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                ,0x1de,
                "bool bssl::tls13_export_keying_material(const SSL *, Span<uint8_t>, Span<const uint8_t>, std::string_view, Span<const uint8_t>)"
               );
}

Assistant:

bool tls13_export_keying_material(const SSL *ssl, Span<uint8_t> out,
                                  Span<const uint8_t> secret,
                                  std::string_view label,
                                  Span<const uint8_t> context) {
  if (secret.empty()) {
    assert(0);
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const EVP_MD *digest = ssl_session_get_digest(SSL_get_session(ssl));

  uint8_t hash_buf[EVP_MAX_MD_SIZE];
  uint8_t export_context_buf[EVP_MAX_MD_SIZE];
  unsigned hash_len;
  unsigned export_context_len;
  if (!EVP_Digest(context.data(), context.size(), hash_buf, &hash_len, digest,
                  nullptr) ||
      !EVP_Digest(nullptr, 0, export_context_buf, &export_context_len, digest,
                  nullptr)) {
    return false;
  }

  auto hash = Span(hash_buf, hash_len);
  auto export_context = Span(export_context_buf, export_context_len);
  uint8_t derived_secret_buf[EVP_MAX_MD_SIZE];
  auto derived_secret = Span(derived_secret_buf, EVP_MD_size(digest));
  return hkdf_expand_label(derived_secret, digest, secret, label,
                           export_context, SSL_is_dtls(ssl)) &&
         hkdf_expand_label(out, digest, derived_secret, kTLS13LabelExportKeying,
                           hash, SSL_is_dtls(ssl));
}